

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slimc.c
# Opt level: O0

void term(item *x)

{
  int op_00;
  item *x_00;
  bool bVar1;
  int op;
  item *y;
  item *x_local;
  
  x_00 = (item *)calloc(1,0x30);
  factor(x);
  while( true ) {
    op_00 = currentSymbol;
    bVar1 = true;
    if (((currentSymbol != 99) && (bVar1 = true, currentSymbol != 100)) &&
       (bVar1 = true, currentSymbol != 0xca)) {
      bVar1 = currentSymbol == 0x6c;
    }
    if (!bVar1) break;
    getSymbol();
    if (op_00 == 0xca) {
      opOne(0xca,x);
    }
    factor(x_00);
    opTwo(op_00,x,x_00);
    if ((op_00 == 0xca) && (x->r != x_00->r)) {
      regs[x->r] = 0;
      x->r = x_00->r;
    }
  }
  return;
}

Assistant:

procedure 
void term(struct item *x) {
	variable struct item *y;
	variable int op;
	op = 0; y = NULL;
	allocMem(y);
	factor(x);
	while ((currentSymbol == SYMBOL_MUL) || (currentSymbol == SYMBOL_DIV) || 
		(currentSymbol == SYMBOL_AND) ||
		(currentSymbol == SYMBOL_MOD)) {
			op = currentSymbol;
			getSymbol();
			if (op == SYMBOL_AND) {
				opOne(op,x);
			}
			factor(y);
			opTwo(op,x,y);
			if (op == SYMBOL_AND) {
				if(x->r != y->r) {
					regs[x->r] = 0;
					x->r = y->r;
				}
			}
		}
}